

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O1

void processEvent(SWindowData *window_data,XEvent *event)

{
  void *pvVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t uVar4;
  mfb_mouse_move_func UNRECOVERED_JUMPTABLE_00;
  mfb_active_func UNRECOVERED_JUMPTABLE;
  mfb_mouse_scroll_func UNRECOVERED_JUMPTABLE_01;
  mfb_key_mod mVar5;
  uint32_t uVar6;
  mfb_key key;
  uint uVar7;
  mfb_mouse_button mVar8;
  float fVar9;
  float fVar10;
  XEvent nev;
  ulong local_e0 [7];
  Time local_a8;
  uint local_8c;
  
  iVar3 = event->type;
  switch(iVar3) {
  case 3:
    pvVar1 = window_data->specific;
    iVar3 = XEventsQueued(*(undefined8 *)((long)pvVar1 + 8),1);
    if (iVar3 != 0) {
      XPeekEvent(*(undefined8 *)((long)pvVar1 + 8),local_e0);
      if ((((uint)local_e0[0] == 2) && (local_a8 == (event->xkey).time)) &&
         (local_8c == (event->xkey).keycode)) {
        return;
      }
    }
  case 2:
    key = KB_KEY_UNKNOWN;
    if ((ulong)(event->xkey).keycode < 0x100) {
      key = (mfb_key)g_keycodes[(event->xkey).keycode];
    }
    iVar3 = event->type;
    uVar4 = translate_mod_ex(key,(event->xcrossing).mode,(uint)(iVar3 == 2));
    window_data->mod_keys = uVar4;
    window_data->key_status[key] = iVar3 == 2;
    if (window_data->keyboard_func != (mfb_keyboard_func)0x0) {
      (*window_data->keyboard_func)((mfb_window *)window_data,key,window_data->mod_keys,iVar3 == 2);
    }
    if (event->type == 2) {
      XLookupString(event,0,0,local_e0,0);
      uVar7 = (uint)local_e0[0];
      if (local_e0[0] - 0x20 < 0x5f || local_e0[0] - 0xa0 < 0x60) {
        if (window_data->char_input_func != (mfb_char_input_func)0x0) {
          (*window_data->char_input_func)((mfb_window *)window_data,uVar7);
        }
      }
      else if ((uVar7 & 0xff000000) == 0x1000000) {
        local_e0[0] = (ulong)(uVar7 & 0xffffff);
      }
      if (window_data->char_input_func != (mfb_char_input_func)0x0) {
        (*window_data->char_input_func)((mfb_window *)window_data,(uint)local_e0[0]);
      }
    }
    break;
  case 4:
  case 5:
    uVar7 = (event->xkey).state;
    mVar8 = (event->xkey).keycode;
    mVar5 = (uVar7 >> 3 & 8 | uVar7 >> 1 & 6 | uVar7 & 1) + (uVar7 & 2) * 8 + (uVar7 & 0x10) * 2;
    window_data->mod_keys = mVar5;
    if (mVar8 == MOUSE_BTN_3) {
      mVar8 = MOUSE_BTN_2;
    }
    else if (mVar8 == MOUSE_BTN_2) {
      mVar8 = MOUSE_BTN_3;
    }
    switch(mVar8) {
    case MOUSE_BTN_4:
      window_data->mouse_wheel_y = 1.0;
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar10 = 1.0;
      break;
    case MOUSE_BTN_5:
      window_data->mouse_wheel_y = -1.0;
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar10 = -1.0;
      break;
    case MOUSE_BTN_6:
      window_data->mouse_wheel_x = 1.0;
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar9 = 1.0;
      goto LAB_00104873;
    case MOUSE_BTN_7:
      window_data->mouse_wheel_x = -1.0;
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar9 = -1.0;
LAB_00104873:
      fVar10 = 0.0;
      goto LAB_00104896;
    default:
      mVar8 = mVar8 - MOUSE_BTN_4;
    case MOUSE_BTN_1:
    case MOUSE_BTN_2:
    case MOUSE_BTN_3:
      window_data->mouse_button_status[mVar8 & MOUSE_BTN_7] = iVar3 == 4;
      if (window_data->mouse_btn_func == (mfb_mouse_button_func)0x0) {
        return;
      }
      (*window_data->mouse_btn_func)((mfb_window *)window_data,mVar8,mVar5,iVar3 == 4);
      return;
    }
    fVar9 = 0.0;
LAB_00104896:
    (*UNRECOVERED_JUMPTABLE_01)((mfb_window *)window_data,mVar5,fVar9,fVar10);
    return;
  case 6:
    window_data->mouse_pos_x = (event->xkey).x;
    window_data->mouse_pos_y = (event->xkey).y;
    UNRECOVERED_JUMPTABLE_00 = window_data->mouse_move_func;
    if (UNRECOVERED_JUMPTABLE_00 != (mfb_mouse_move_func)0x0) {
      uVar4 = (event->xkey).x;
      uVar6 = (event->xkey).y;
LAB_0010462b:
      (*UNRECOVERED_JUMPTABLE_00)((mfb_window *)window_data,uVar4,uVar6);
      return;
    }
    break;
  case 7:
  case 8:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    break;
  case 9:
    window_data->is_active = true;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      _Var2 = true;
LAB_0010477c:
      (*UNRECOVERED_JUMPTABLE)((mfb_window *)window_data,_Var2);
      return;
    }
    break;
  case 10:
    window_data->is_active = false;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      _Var2 = false;
      goto LAB_0010477c;
    }
    break;
  case 0x16:
    window_data->window_width = (event->xexpose).count;
    window_data->window_height = (event->xgraphicsexpose).major_code;
    resize_dst(window_data,(event->xexpose).count,(event->xgraphicsexpose).major_code);
    resize_GL(window_data);
    UNRECOVERED_JUMPTABLE_00 = window_data->resize_func;
    if (UNRECOVERED_JUMPTABLE_00 != (mfb_mouse_move_func)0x0) {
      uVar4 = window_data->window_width;
      uVar6 = window_data->window_height;
      goto LAB_0010462b;
    }
    break;
  default:
    if (iVar3 != 0x21) {
      return;
    }
    if ((event->xkey).time != s_delete_window_atom) {
      return;
    }
    if ((window_data->close_func != (mfb_close_func)0x0) &&
       (_Var2 = (*window_data->close_func)((mfb_window *)window_data), !_Var2)) {
      return;
    }
  case 0x11:
    window_data->close = true;
  }
  return;
}

Assistant:

static void
processEvent(SWindowData *window_data, XEvent *event) {
    switch (event->type) {
        case KeyPress:
        case KeyRelease:
        {
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if ((event->type == KeyRelease) &&
                XEventsQueued(window_data_x11->display, QueuedAfterReading)) {
                XEvent nev;
                XPeekEvent(window_data_x11->display, &nev);

                if ((nev.type == KeyPress) && (nev.xkey.time == event->xkey.time) &&
                    (nev.xkey.keycode == event->xkey.keycode)) {
                    /* Key wasn’t actually released */
                    return;
                }
            }

            mfb_key key_code      = (mfb_key) translate_key(event->xkey.keycode);
            int is_pressed        = (event->type == KeyPress);
            window_data->mod_keys = translate_mod_ex(key_code, event->xkey.state, is_pressed);

            window_data->key_status[key_code] = is_pressed;
            kCall(keyboard_func, key_code, (mfb_key_mod) window_data->mod_keys, is_pressed);

            if(event->type == KeyPress) {
                KeySym keysym;
                XLookupString(&event->xkey, NULL, 0, &keysym, NULL);

                if ((keysym >= 0x0020 && keysym <= 0x007e) ||
                    (keysym >= 0x00a0 && keysym <= 0x00ff)) {
                    kCall(char_input_func, keysym);
                }
                else if ((keysym & 0xff000000) == 0x01000000) {
                    keysym = keysym & 0x00ffffff;
                }

                kCall(char_input_func, keysym);

                // TODO: Investigate a bit more the xkbcommon api

                // This does not seem to be working properly
                //unsigned int codepoint = xkb_state_key_get_utf32(state, keysym);
                //if (codepoint != 0)
                //    kCall(char_input_func, codepoint);
            }
        }
        break;

        case ButtonPress:
        case ButtonRelease:
        {
            mfb_mouse_button button = (mfb_mouse_button) event->xbutton.button;
            int          is_pressed = (event->type == ButtonPress);
            window_data->mod_keys   = translate_mod(event->xkey.state);

            // Swap mouse right and middle for parity with other platforms:
            // https://github.com/emoon/minifb/issues/65
            switch (button) {
                case Button2:
                    button = Button3;
                    break;
                case Button3:
                    button = Button2;
                    break;
            }

            switch (button) {
                case Button1:
                case Button2:
                case Button3:
                    window_data->mouse_button_status[button & 0x07] = is_pressed;
                    kCall(mouse_btn_func, button, (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;

                case Button4:
                    window_data->mouse_wheel_y = 1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, window_data->mouse_wheel_y);
                    break;
                case Button5:
                    window_data->mouse_wheel_y = -1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, window_data->mouse_wheel_y);
                    break;

                case 6:
                    window_data->mouse_wheel_x = 1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, window_data->mouse_wheel_x, 0.0f);
                    break;
                case 7:
                    window_data->mouse_wheel_x = -1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, window_data->mouse_wheel_x, 0.0f);
                    break;

                default:
                    window_data->mouse_button_status[(button - 4) & 0x07] = is_pressed;
                    kCall(mouse_btn_func, (mfb_mouse_button) (button - 4), (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;
            }
        }
        break;

        case MotionNotify:
            window_data->mouse_pos_x = event->xmotion.x;
            window_data->mouse_pos_y = event->xmotion.y;
            kCall(mouse_move_func, event->xmotion.x, event->xmotion.y);
            break;

        case ConfigureNotify:
        {
            window_data->window_width  = event->xconfigure.width;
            window_data->window_height = event->xconfigure.height;
            resize_dst(window_data, event->xconfigure.width, event->xconfigure.height);

#if defined(USE_OPENGL_API)
            resize_GL(window_data);
#else
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if(window_data_x11->image_scaler != 0x0) {
                window_data_x11->image_scaler->data = 0x0;
                XDestroyImage(window_data_x11->image_scaler);
                window_data_x11->image_scaler        = 0x0;
                window_data_x11->image_scaler_width  = 0;
                window_data_x11->image_scaler_height = 0;
            }
            XClearWindow(window_data_x11->display, window_data_x11->window);
#endif
            kCall(resize_func, window_data->window_width, window_data->window_height);
        }
        break;

        case EnterNotify:
        case LeaveNotify:
        break;

        case FocusIn:
            window_data->is_active = true;
            kCall(active_func, true);
            break;

        case FocusOut:
            window_data->is_active = false;
            kCall(active_func, false);
            break;

        case DestroyNotify:
            window_data->close = true;
            return;
            break;

        case ClientMessage:
        {
            if ((Atom)event->xclient.data.l[0] == s_delete_window_atom) {
                if (window_data) {
                    bool destroy = false;

                    // Obtain a confirmation of close
                    if (!window_data->close_func || window_data->close_func((struct mfb_window*)window_data)) {
                        destroy = true;
                    }

                    if (destroy) {
                        window_data->close = true;
                        return;
                    }
                }
            }
        }
        break;
    }
}